

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm.cpp
# Opt level: O1

int __thiscall ncnn::LayerNorm::load_model(LayerNorm *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  void *local_78;
  int *piStack_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  size_t local_38;
  
  if (this->affine == 0) {
    iVar5 = 0;
  }
  else {
    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->affine_size,1);
    pMVar1 = &this->gamma_data;
    if (pMVar1 != (Mat *)&local_78) {
      if (piStack_70 != (int *)0x0) {
        LOCK();
        *piStack_70 = *piStack_70 + 1;
        UNLOCK();
      }
      piVar2 = (this->gamma_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->gamma_data).data;
          pAVar4 = (this->gamma_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->gamma_data).cstep = 0;
      *(undefined8 *)((long)&(this->gamma_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->gamma_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->gamma_data).refcount = (int *)0x0;
      (this->gamma_data).dims = 0;
      (this->gamma_data).w = 0;
      (this->gamma_data).h = 0;
      (this->gamma_data).d = 0;
      (this->gamma_data).c = 0;
      (this->gamma_data).data = local_78;
      (this->gamma_data).refcount = piStack_70;
      (this->gamma_data).elemsize = local_68;
      (this->gamma_data).elempack = local_60;
      (this->gamma_data).allocator = local_58;
      (this->gamma_data).dims = local_50;
      (this->gamma_data).w = iStack_4c;
      (this->gamma_data).h = iStack_48;
      (this->gamma_data).d = iStack_44;
      (this->gamma_data).c = local_40;
      (this->gamma_data).cstep = local_38;
    }
    if (piStack_70 != (int *)0x0) {
      LOCK();
      *piStack_70 = *piStack_70 + -1;
      UNLOCK();
      if (*piStack_70 == 0) {
        if (local_58 == (Allocator *)0x0) {
          if (local_78 != (void *)0x0) {
            free(local_78);
          }
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    iVar5 = -100;
    if ((pMVar1->data != (void *)0x0) &&
       ((long)(this->gamma_data).c * (this->gamma_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->affine_size);
      pMVar1 = &this->beta_data;
      if (pMVar1 != (Mat *)&local_78) {
        if (piStack_70 != (int *)0x0) {
          LOCK();
          *piStack_70 = *piStack_70 + 1;
          UNLOCK();
        }
        piVar2 = (this->beta_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->beta_data).data;
            pAVar4 = (this->beta_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->beta_data).cstep = 0;
        *(undefined8 *)((long)&(this->beta_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->beta_data).elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->beta_data).refcount = (int *)0x0;
        (this->beta_data).dims = 0;
        (this->beta_data).w = 0;
        (this->beta_data).h = 0;
        (this->beta_data).d = 0;
        (this->beta_data).c = 0;
        (this->beta_data).data = local_78;
        (this->beta_data).refcount = piStack_70;
        (this->beta_data).elemsize = local_68;
        (this->beta_data).elempack = local_60;
        (this->beta_data).allocator = local_58;
        (this->beta_data).dims = local_50;
        (this->beta_data).w = iStack_4c;
        (this->beta_data).h = iStack_48;
        (this->beta_data).d = iStack_44;
        (this->beta_data).c = local_40;
        (this->beta_data).cstep = local_38;
      }
      if (piStack_70 != (int *)0x0) {
        LOCK();
        *piStack_70 = *piStack_70 + -1;
        UNLOCK();
        if (*piStack_70 == 0) {
          if (local_58 == (Allocator *)0x0) {
            if (local_78 != (void *)0x0) {
              free(local_78);
            }
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
      if ((pMVar1->data != (void *)0x0) &&
         (iVar5 = -100, (long)(this->beta_data).c * (this->beta_data).cstep != 0)) {
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int LayerNorm::load_model(const ModelBin& mb)
{
    if (affine == 0)
        return 0;

    gamma_data = mb.load(affine_size, 1);
    if (gamma_data.empty())
        return -100;

    beta_data = mb.load(affine_size, 1);
    if (beta_data.empty())
        return -100;

    return 0;
}